

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potrf.hpp
# Opt level: O0

size_t remora::bindings::potrf_recursive<remora::matrix<double,remora::row_major,remora::cpu_tag>>
                 (undefined8 param_1,long param_2,undefined8 param_3)

{
  size_type sVar1;
  long lVar2;
  type Alr;
  type All;
  type Aul;
  size_t result;
  size_t split;
  size_t numBlocks;
  size_t size;
  type A;
  size_t block_size;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_fffffffffffffef8;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::column_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff00;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff08;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff18;
  matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_stack_ffffffffffffff40;
  dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag> local_50;
  ulong local_30;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  size_t local_8;
  
  local_30 = 0x20;
  local_28 = param_3;
  local_20 = param_2;
  local_18 = param_1;
  subrange<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28,(size_t)in_stack_ffffffffffffff20);
  sVar1 = dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>::size1
                    (&local_50);
  if (local_30 < sVar1) {
    sVar1 = dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>::
            size1(&local_50);
    lVar2 = (((sVar1 + local_30) - 1) / local_30 >> 1) * local_30;
    local_8 = potrf_recursive<remora::matrix<double,remora::row_major,remora::cpu_tag>>
                        (local_18,local_20,local_20 + lVar2);
    if (local_8 == 0) {
      subrange<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
                 (size_t)in_stack_ffffffffffffff00);
      subrange<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
                 (size_t)in_stack_ffffffffffffff00);
      subrange<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (size_t)in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08,
                 (size_t)in_stack_ffffffffffffff00);
      trans<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::cpu_tag>
                ((matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                  *)in_stack_ffffffffffffff00);
      kernels::
      trsm<remora::triangular_tag<true,false>,remora::system_tag<false>,remora::dense_matrix_adaptor<double,remora::column_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      kernels::
      syrk<false,remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>>
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (value_type)in_stack_ffffffffffffff00);
      local_8 = potrf_recursive<remora::matrix<double,remora::row_major,remora::cpu_tag>>
                          (local_18,local_20 + lVar2,local_28);
    }
  }
  else {
    local_8 = potrf_block<remora::dense_matrix_adaptor<double,remora::row_major,remora::dense_tag,remora::cpu_tag>>
                        (&local_50);
  }
  return local_8;
}

Assistant:

std::size_t potrf_recursive(
	matrix_expression<MatA, cpu_tag>& Afull,
	std::size_t start,
	std::size_t end,
	lower
){
	std::size_t block_size = 32;
	auto A = subrange(Afull,start,end,start,end);
	std::size_t size = A.size1();
	//if the matrix is small enough call the computation kernel directly for the block
	if(size <= block_size){
		return potrf_block(A,typename MatA::orientation(), lower());
	}
	std::size_t numBlocks = (A.size1()+block_size-1)/block_size;
	std::size_t split = numBlocks/2*block_size;
	
	
	//otherwise run the kernel recursively
	std::size_t result = potrf_recursive(Afull,start,start+split,lower());
	if(result) return result;
	
	auto Aul = subrange(A,0,split,0,split);
	auto All = subrange(A,split,size,0,split);
	auto Alr = subrange(A,split,size,split,size);
	kernels::trsm<upper,right>(trans(Aul), All );
	kernels::syrk<false>(All,Alr, -1.0);
	return potrf_recursive(Afull,start+split,end,lower());
}